

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O0

void __thiscall
TEST_TestRegistry_ResetPluginsWorks_Test::testBody(TEST_TestRegistry_ResetPluginsWorks_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_90;
  undefined1 local_80 [8];
  MyTestPluginDummy plugin2;
  SimpleString local_48;
  undefined1 local_38 [8];
  MyTestPluginDummy plugin1;
  TEST_TestRegistry_ResetPluginsWorks_Test *this_local;
  
  plugin1.super_TestPlugin._32_8_ = this;
  SimpleString::SimpleString(&local_48,"Plugin-1");
  MyTestPluginDummy::MyTestPluginDummy((MyTestPluginDummy *)local_38,&local_48);
  SimpleString::~SimpleString(&local_48);
  SimpleString::SimpleString(&local_90,"Plugin-2");
  MyTestPluginDummy::MyTestPluginDummy((MyTestPluginDummy *)local_80,&local_90);
  SimpleString::~SimpleString(&local_90);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[0xd])(pTVar1,local_38);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[0xd])(pTVar1,local_80);
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x12])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,(long)iVar2,"LONGS_EQUAL(2, myRegistry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x146,pTVar4);
  (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry[0xe])();
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x12])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar2,"LONGS_EQUAL(0, myRegistry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x148,pTVar4);
  MyTestPluginDummy::~MyTestPluginDummy((MyTestPluginDummy *)local_80);
  MyTestPluginDummy::~MyTestPluginDummy((MyTestPluginDummy *)local_38);
  return;
}

Assistant:

TEST(TestRegistry, ResetPluginsWorks)
{
    MyTestPluginDummy plugin1("Plugin-1");
    MyTestPluginDummy plugin2("Plugin-2");
    myRegistry->installPlugin(&plugin1);
    myRegistry->installPlugin(&plugin2);
    LONGS_EQUAL(2, myRegistry->countPlugins());
    myRegistry->resetPlugins();
    LONGS_EQUAL(0, myRegistry->countPlugins());
}